

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderTextureFunctionTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::ShaderTextureFunctionCase::initShaderSources
          (ShaderTextureFunctionCase *this)

{
  bool bVar1;
  bool bVar2;
  Function FVar3;
  TextureType TVar4;
  DataType DVar5;
  char *pcVar6;
  char *pcVar7;
  TextureFormat format;
  ulong uVar8;
  ostream *poVar9;
  ostringstream *this_00;
  char *texCoord;
  char *pcVar10;
  int iVar11;
  ostringstream *poVar12;
  ostringstream *poVar13;
  char *lodBias;
  bool bVar14;
  bool bVar15;
  char *local_350;
  string local_340 [32];
  ostringstream vert;
  ostringstream frag;
  
  FVar3 = (this->m_lookupSpec).function;
  bVar1 = (this->super_ShaderRenderCase).m_isVertexCase;
  bVar15 = (this->m_textureSpec).type == TEXTURETYPE_2D;
  iVar11 = ((FVar3 == FUNCTION_TEXTUREPROJLOD || FVar3 == FUNCTION_TEXTUREPROJ) && bVar15) + 1;
  bVar14 = FVar3 - FUNCTION_TEXTURELOD < 3;
  bVar2 = (this->m_lookupSpec).useBias;
  if ((0x36U >> ((byte)FVar3 & 0x1f) & 1) == 0) {
    iVar11 = 0;
  }
  if (FUNCTION_TEXTUREPROJLOD3 < FVar3) {
    iVar11 = 0;
  }
  DVar5 = glu::getDataTypeFloatVec(iVar11 + (bVar15 ^ 3));
  pcVar6 = glu::getDataTypeName(DVar5);
  pcVar7 = glu::getPrecisionName(PRECISION_MEDIUMP);
  format = glu::mapGLTransferFormat((this->m_textureSpec).format,(this->m_textureSpec).dataType);
  TVar4 = (this->m_textureSpec).type;
  pcVar10 = "textureCube";
  if (TVar4 == TEXTURETYPE_2D) {
    pcVar10 = "texture2D";
  }
  if (TVar4 == TEXTURETYPE_CUBE_MAP) {
    DVar5 = glu::getSamplerCubeType(format);
  }
  else if (TVar4 == TEXTURETYPE_2D) {
    DVar5 = glu::getSampler2DType(format);
  }
  else {
    DVar5 = TYPE_LAST;
  }
  uVar8 = (ulong)(this->m_lookupSpec).function;
  if (uVar8 < 6) {
    local_350 = &DAT_0181111c + *(int *)(&DAT_0181111c + uVar8 * 4);
  }
  else {
    local_350 = (char *)0x0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vert);
  this_00 = (ostringstream *)&frag;
  std::__cxx11::ostringstream::ostringstream(this_00);
  poVar12 = this_00;
  if (bVar1 != false) {
    poVar12 = (ostringstream *)&vert;
  }
  poVar9 = std::operator<<((ostream *)&vert,"attribute highp vec4 a_position;\n");
  poVar9 = std::operator<<(poVar9,"attribute ");
  poVar9 = std::operator<<(poVar9,pcVar7);
  poVar9 = std::operator<<(poVar9," ");
  poVar9 = std::operator<<(poVar9,pcVar6);
  std::operator<<(poVar9," a_in0;\n");
  if (bVar14 || (bVar2 & 1U) != 0) {
    poVar9 = std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,"attribute ");
    poVar9 = std::operator<<(poVar9,pcVar7);
    std::operator<<(poVar9," float a_in1;\n");
  }
  if (bVar1 == false) {
    poVar9 = std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,"varying ");
    poVar9 = std::operator<<(poVar9,pcVar7);
    poVar9 = std::operator<<(poVar9," ");
    poVar9 = std::operator<<(poVar9,pcVar6);
    std::operator<<(poVar9," v_texCoord;\n");
    poVar9 = std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"varying ");
    poVar9 = std::operator<<(poVar9,pcVar7);
    poVar9 = std::operator<<(poVar9," ");
    poVar9 = std::operator<<(poVar9,pcVar6);
    std::operator<<(poVar9," v_texCoord;\n");
    if (bVar14 || (bVar2 & 1U) != 0) {
      poVar9 = std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,"varying ");
      poVar9 = std::operator<<(poVar9,pcVar7);
      pcVar6 = " float v_lodBias;\n";
      std::operator<<(poVar9," float v_lodBias;\n");
      poVar9 = std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"varying ");
      this_00 = (ostringstream *)std::operator<<(poVar9,pcVar7);
      goto LAB_00e95c35;
    }
  }
  else {
    pcVar6 = "varying mediump vec4 v_color;\n";
    std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,
                    "varying mediump vec4 v_color;\n");
LAB_00e95c35:
    std::operator<<((ostream *)this_00,pcVar6);
  }
  poVar9 = std::operator<<((ostream *)poVar12,"uniform lowp ");
  pcVar6 = glu::getDataTypeName(DVar5);
  poVar9 = std::operator<<(poVar9,pcVar6);
  std::operator<<(poVar9," u_sampler;\n");
  poVar9 = std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,
                           "\nvoid main()\n{\n");
  std::operator<<(poVar9,"\tgl_Position = a_position;\n");
  poVar13 = &frag;
  std::operator<<(&poVar13->super_basic_ostream<char,_std::char_traits<char>_>,"\nvoid main()\n{\n")
  ;
  if (bVar1 == false) {
    std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\tgl_FragColor = ");
    pcVar6 = "v_texCoord";
    pcVar7 = "v_lodBias";
  }
  else {
    std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,"\tv_color = ");
    pcVar6 = "a_in0";
    pcVar7 = "a_in1";
  }
  poVar9 = std::operator<<((ostream *)poVar12,pcVar10);
  std::operator<<(poVar9,local_350);
  poVar9 = std::operator<<((ostream *)poVar12,"(u_sampler, ");
  std::operator<<(poVar9,pcVar6);
  if ((FVar3 - FUNCTION_TEXTURELOD < 3) || ((this->m_lookupSpec).useBias == true)) {
    poVar9 = std::operator<<((ostream *)poVar12,", ");
    std::operator<<(poVar9,pcVar7);
  }
  std::operator<<((ostream *)poVar12,");\n");
  if (bVar1 == false) {
    poVar13 = &vert;
    std::operator<<(&poVar13->super_basic_ostream<char,_std::char_traits<char>_>,
                    "\tv_texCoord = a_in0;\n");
    if (!bVar14 && (bVar2 & 1U) == 0) goto LAB_00e95d99;
    pcVar6 = "\tv_lodBias = a_in1;\n";
  }
  else {
    pcVar6 = "\tgl_FragColor = v_color;\n";
  }
  std::operator<<(&poVar13->super_basic_ostream<char,_std::char_traits<char>_>,pcVar6);
LAB_00e95d99:
  std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,local_340);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,local_340);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vert);
  return;
}

Assistant:

void ShaderTextureFunctionCase::initShaderSources (void)
{
	Function			function			= m_lookupSpec.function;
	bool				isVtxCase			= m_isVertexCase;
	bool				isProj				= functionHasProj(function);
	bool				is2DProj4			= m_textureSpec.type == TEXTURETYPE_2D && (function == FUNCTION_TEXTUREPROJ || function == FUNCTION_TEXTUREPROJLOD);
	bool				hasLodBias			= functionHasLod(m_lookupSpec.function) || m_lookupSpec.useBias;
	int					texCoordComps		= m_textureSpec.type == TEXTURETYPE_2D ? 2 : 3;
	int					extraCoordComps		= isProj ? (is2DProj4 ? 2 : 1) : 0;
	glu::DataType		coordType			= glu::getDataTypeFloatVec(texCoordComps+extraCoordComps);
	glu::Precision		coordPrec			= glu::PRECISION_MEDIUMP;
	const char*			coordTypeName		= glu::getDataTypeName(coordType);
	const char*			coordPrecName		= glu::getPrecisionName(coordPrec);
	tcu::TextureFormat	texFmt				= glu::mapGLTransferFormat(m_textureSpec.format, m_textureSpec.dataType);
	glu::DataType		samplerType			= glu::TYPE_LAST;
	const char*			baseFuncName		= m_textureSpec.type == TEXTURETYPE_2D ? "texture2D" : "textureCube";
	const char*			funcExt				= DE_NULL;

	switch (m_textureSpec.type)
	{
		case TEXTURETYPE_2D:		samplerType = glu::getSampler2DType(texFmt);		break;
		case TEXTURETYPE_CUBE_MAP:	samplerType = glu::getSamplerCubeType(texFmt);		break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	switch (m_lookupSpec.function)
	{
		case FUNCTION_TEXTURE:			funcExt = "";			break;
		case FUNCTION_TEXTUREPROJ:		funcExt = "Proj";		break;
		case FUNCTION_TEXTUREPROJ3:		funcExt = "Proj";		break;
		case FUNCTION_TEXTURELOD:		funcExt = "Lod";		break;
		case FUNCTION_TEXTUREPROJLOD:	funcExt = "ProjLod";	break;
		case FUNCTION_TEXTUREPROJLOD3:	funcExt = "ProjLod";	break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	std::ostringstream	vert;
	std::ostringstream	frag;
	std::ostringstream&	op		= isVtxCase ? vert : frag;

	vert << "attribute highp vec4 a_position;\n"
		 << "attribute " << coordPrecName << " " << coordTypeName << " a_in0;\n";

	if (hasLodBias)
		vert << "attribute " << coordPrecName << " float a_in1;\n";

	if (isVtxCase)
	{
		vert << "varying mediump vec4 v_color;\n";
		frag << "varying mediump vec4 v_color;\n";
	}
	else
	{
		vert << "varying " << coordPrecName << " " << coordTypeName << " v_texCoord;\n";
		frag << "varying " << coordPrecName << " " << coordTypeName << " v_texCoord;\n";

		if (hasLodBias)
		{
			vert << "varying " << coordPrecName << " float v_lodBias;\n";
			frag << "varying " << coordPrecName << " float v_lodBias;\n";
		}
	}

	// Uniforms
	op << "uniform lowp " << glu::getDataTypeName(samplerType) << " u_sampler;\n";

	vert << "\nvoid main()\n{\n"
		 << "\tgl_Position = a_position;\n";
	frag << "\nvoid main()\n{\n";

	if (isVtxCase)
		vert << "\tv_color = ";
	else
		frag << "\tgl_FragColor = ";

	// Op.
	{
		const char*	texCoord	= isVtxCase ? "a_in0" : "v_texCoord";
		const char*	lodBias		= isVtxCase ? "a_in1" : "v_lodBias";

		op << baseFuncName << funcExt;
		op << "(u_sampler, " << texCoord;

		if (functionHasLod(function) || m_lookupSpec.useBias)
			op << ", " << lodBias;

		op << ");\n";
	}

	if (isVtxCase)
		frag << "\tgl_FragColor = v_color;\n";
	else
	{
		vert << "\tv_texCoord = a_in0;\n";

		if (hasLodBias)
			vert << "\tv_lodBias = a_in1;\n";
	}

	vert << "}\n";
	frag << "}\n";

	m_vertShaderSource = vert.str();
	m_fragShaderSource = frag.str();
}